

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

MultisamplePixelBufferAccess *
rr::getSubregion(MultisamplePixelBufferAccess *__return_storage_ptr__,
                MultisamplePixelBufferAccess *access,int x,int y,int width,int height)

{
  int z;
  int y_00;
  int width_00;
  PixelBufferAccess *access_00;
  PixelBufferAccess local_50;
  int local_28;
  int local_24;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  MultisamplePixelBufferAccess *access_local;
  
  local_28 = height;
  local_24 = width;
  height_local = y;
  width_local = x;
  _y_local = access;
  access_local = __return_storage_ptr__;
  access_00 = MultisamplePixelBufferAccess::raw(access);
  y_00 = width_local;
  z = height_local;
  width_00 = MultisamplePixelBufferAccess::getNumSamples(_y_local);
  tcu::getSubregion(&local_50,access_00,0,y_00,z,width_00,local_24,local_28);
  MultisamplePixelBufferAccess::fromMultisampleAccess(__return_storage_ptr__,&local_50);
  return __return_storage_ptr__;
}

Assistant:

MultisamplePixelBufferAccess getSubregion (const MultisamplePixelBufferAccess& access, int x, int y, int width, int height)
{
	return MultisamplePixelBufferAccess::fromMultisampleAccess(tcu::getSubregion(access.raw(), 0, x, y, access.getNumSamples(), width, height));
}